

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quath *q)

{
  long lVar1;
  mat<double,_3,_3> *pmVar2;
  matrix3d *pmVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double3x3 m33;
  
  bVar4 = 0;
  fVar5 = value::half_to_float((half)(q->imag)._M_elems[0].value);
  fVar6 = value::half_to_float((half)(q->imag)._M_elems[1].value);
  fVar7 = value::half_to_float((half)(q->imag)._M_elems[2].value);
  fVar8 = value::half_to_float((half)(q->real).value);
  local_78._8_4_ = SUB84((double)fVar6,0);
  local_78._0_8_ = (double)fVar5;
  local_78._12_4_ = (int)((ulong)(double)fVar6 >> 0x20);
  local_68._8_4_ = SUB84((double)fVar8,0);
  local_68._0_8_ = (double)fVar7;
  local_68._12_4_ = (int)((ulong)(double)fVar8 >> 0x20);
  linalg::qmat<double>(&m33,(vec<double,_4> *)local_78);
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  Identity(__return_storage_ptr__);
  pmVar2 = &m33;
  pmVar3 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar3->m[0][0] = (pmVar2->x).x;
    pmVar2 = (mat<double,_3,_3> *)((long)pmVar2 + (ulong)bVar4 * -0x10 + 8);
    pmVar3 = (matrix3d *)((long)pmVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quath &q) {
  double3x3 m33 = linalg::qmat<double>(
      {double(half_to_float(q.imag[0])), double(half_to_float(q.imag[1])),
       double(half_to_float(q.imag[2])), double(half_to_float(q.real))});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}